

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O3

Region * __thiscall
GOESNImageHandler::loadRegion
          (Region *__return_storage_ptr__,GOESNImageHandler *this,NOAALRITHeader *h)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  array<char,_32UL> buf;
  long *local_68 [2];
  long local_58 [2];
  char local_48 [32];
  
  (__return_storage_ptr__->nameShort)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nameShort).field_2;
  (__return_storage_ptr__->nameShort)._M_string_length = 0;
  (__return_storage_ptr__->nameShort).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nameLong)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nameLong).field_2;
  (__return_storage_ptr__->nameLong)._M_string_length = 0;
  (__return_storage_ptr__->nameLong).field_2._M_local_buf[0] = '\0';
  uVar3 = (uint)h->productSubID + (h->productSubID / 5 & 0xfffffffe) * -5 & 0xffff;
  switch(uVar3) {
  case 1:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b17a7);
    pcVar2 = "Full Disk";
    break;
  case 2:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b17b4);
    pcVar2 = "Northern Hemisphere";
    break;
  case 3:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b17cb);
    pcVar2 = "Southern Hemisphere";
    break;
  case 4:
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b17e2);
    pcVar2 = "United States";
    break;
  default:
    uVar3 = uVar3 - 5;
    iVar1 = snprintf(local_48,0x20,"SI%02d",(ulong)uVar3);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_48 + iVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    iVar1 = snprintf(local_48,0x20,"Special Interest %d",(ulong)uVar3);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,local_48,local_48 + iVar1);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->nameLong,(string *)local_68);
    if (local_68[0] == local_58) {
      return __return_storage_ptr__;
    }
    operator_delete(local_68[0],local_58[0] + 1);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->nameLong,0,
             (char *)(__return_storage_ptr__->nameLong)._M_string_length,(ulong)pcVar2);
  return __return_storage_ptr__;
}

Assistant:

Region GOESNImageHandler::loadRegion(const lrit::NOAALRITHeader& h) const {
  Region region;
  if (h.productSubID % 10 == 1) {
    region.nameShort = "FD";
    region.nameLong = "Full Disk";
  } else if (h.productSubID % 10 == 2) {
    region.nameShort = "NH";
    region.nameLong = "Northern Hemisphere";
  } else if (h.productSubID % 10 == 3) {
    region.nameShort = "SH";
    region.nameLong = "Southern Hemisphere";
  } else if (h.productSubID % 10 == 4) {
    region.nameShort = "US";
    region.nameLong = "United States";
  } else {
    std::array<char, 32> buf;
    size_t len;
    auto num = (h.productSubID % 10) - 5;
    len = snprintf(buf.data(), buf.size(), "SI%02d", num);
    region.nameShort = std::string(buf.data(), len);
    len = snprintf(buf.data(), buf.size(), "Special Interest %d", num);
    region.nameLong = std::string(buf.data(), len);
  }
  return region;
}